

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_divso(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  TCGContext_conflict10 *tcg_ctx;
  TCGTemp *local_28;
  long local_20;
  long local_18;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode;
  local_28 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_20 = (long)&tcg_ctx->pool_cur + *(long *)((long)cpu_gpr + (ulong)(uVar1 >> 0xd & 0xf8));
  local_18 = (long)&tcg_ctx->pool_cur + *(long *)((long)cpu_gpr + (ulong)(uVar1 >> 8 & 0xf8));
  tcg_gen_callN_ppc64(tcg_ctx,helper_divso_ppc64,
                      (TCGTemp *)
                      ((long)&tcg_ctx->pool_cur +
                      *(long *)((long)cpu_gpr + (ulong)(uVar1 >> 0x12 & 0xf8))),3,&local_28);
  if ((ctx->opcode & 1) != 0) {
    gen_set_Rc0(ctx,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)));
  }
  return;
}

Assistant:

static void gen_divso(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    gen_helper_divso(tcg_ctx, cpu_gpr[rD(ctx->opcode)], tcg_ctx->cpu_env,
                     cpu_gpr[rA(ctx->opcode)], cpu_gpr[rB(ctx->opcode)]);
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, cpu_gpr[rD(ctx->opcode)]);
    }
}